

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall cmFindPackageCommand::FindConfig(cmFindPackageCommand *this)

{
  bool bVar1;
  bool bVar2;
  string init;
  undefined1 local_a0 [48];
  cmAlphaNum local_70;
  string local_40;
  
  ComputePrefixes(this);
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_a0._8_8_ = (this->DebugBuffer)._M_dataplus._M_p;
    local_a0._0_8_ = (this->DebugBuffer)._M_string_length;
    local_70.View_._M_len = 0x34;
    local_70.View_._M_str = "find_package considered the following locations for ";
    cmStrCat<std::__cxx11::string,char[19]>
              (&local_40,(cmAlphaNum *)local_a0,&local_70,&this->Name,
               (char (*) [19])"\'s Config module:\n");
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (((this->super_cmFindCommon).SearchFrameworkFirst == false) &&
     ((this->super_cmFindCommon).SearchFrameworkOnly != true)) {
LAB_002ece75:
    if (((this->super_cmFindCommon).SearchAppBundleFirst == false) &&
       ((this->super_cmFindCommon).SearchAppBundleOnly != true)) {
      bVar2 = false;
LAB_002ece97:
      if (((this->super_cmFindCommon).SearchFrameworkOnly == false) &&
         ((this->super_cmFindCommon).SearchAppBundleOnly == false)) {
        bVar2 = FindPrefixedConfig(this);
      }
    }
    else {
      bVar2 = FindAppBundleConfig(this);
      if (!bVar2) goto LAB_002ece97;
    }
    if ((bVar2 == false) && ((this->super_cmFindCommon).SearchFrameworkLast == true)) {
      bVar2 = FindFrameworkConfig(this);
    }
    if ((bVar2 == false) && ((this->super_cmFindCommon).SearchAppBundleLast == true)) {
      bVar2 = FindAppBundleConfig(this);
    }
  }
  else {
    bVar1 = FindFrameworkConfig(this);
    bVar2 = true;
    if (!bVar1) goto LAB_002ece75;
  }
  if ((this->super_cmFindCommon).DebugMode == true) {
    if (bVar2 == false) {
      local_a0._8_8_ = (this->DebugBuffer)._M_dataplus._M_p;
      local_a0._0_8_ = (this->DebugBuffer)._M_string_length;
      local_70.View_._M_len = (size_t)&DAT_00000018;
      local_70.View_._M_str = "The file was not found.\n";
      cmStrCat<>(&local_40,(cmAlphaNum *)local_a0,&local_70);
      std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
LAB_002ed014:
      local_a0._0_8_ = local_a0 + 0x10;
      local_a0[0x10] = '\0';
      local_a0._8_8_ = (char *)0x0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     &this->Variable,"-NOTFOUND");
      std::__cxx11::string::operator=((string *)local_a0,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      bVar1 = false;
      goto LAB_002ed048;
    }
    local_a0._8_8_ = (this->DebugBuffer)._M_dataplus._M_p;
    local_a0._0_8_ = (this->DebugBuffer)._M_string_length;
    local_70.View_._M_len = (size_t)&DAT_00000018;
    local_70.View_._M_str = "The file was found at\n  ";
    cmStrCat<std::__cxx11::string,char[2]>
              (&local_40,(cmAlphaNum *)local_a0,&local_70,&this->FileFound,(char (*) [2])0x64a205);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else if (bVar2 == false) goto LAB_002ed014;
  local_a0._0_8_ = local_a0 + 0x10;
  local_a0[0x10] = '\0';
  local_a0._8_8_ = (char *)0x0;
  cmsys::SystemTools::GetFilenamePath((string *)&local_70,&this->FileFound);
  std::__cxx11::string::operator=((string *)local_a0,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = true;
LAB_002ed048:
  SetConfigDirCacheVariable(this,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  return bVar1;
}

Assistant:

bool cmFindPackageCommand::FindConfig()
{
  // Compute the set of search prefixes.
  this->ComputePrefixes();

  // Look for the project's configuration file.
  bool found = false;
  if (this->DebugMode) {
    this->DebugBuffer = cmStrCat(this->DebugBuffer,
                                 "find_package considered the following "
                                 "locations for ",
                                 this->Name, "'s Config module:\n");
  }

  // Search for frameworks.
  if (!found && (this->SearchFrameworkFirst || this->SearchFrameworkOnly)) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && (this->SearchAppBundleFirst || this->SearchAppBundleOnly)) {
    found = this->FindAppBundleConfig();
  }

  // Search prefixes.
  if (!found && !(this->SearchFrameworkOnly || this->SearchAppBundleOnly)) {
    found = this->FindPrefixedConfig();
  }

  // Search for frameworks.
  if (!found && this->SearchFrameworkLast) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && this->SearchAppBundleLast) {
    found = this->FindAppBundleConfig();
  }

  if (this->DebugMode) {
    if (found) {
      this->DebugBuffer = cmStrCat(
        this->DebugBuffer, "The file was found at\n  ", this->FileFound, "\n");
    } else {
      this->DebugBuffer =
        cmStrCat(this->DebugBuffer, "The file was not found.\n");
    }
  }

  // Store the entry in the cache so it can be set by the user.
  std::string init;
  if (found) {
    init = cmSystemTools::GetFilenamePath(this->FileFound);
  } else {
    init = this->Variable + "-NOTFOUND";
  }
  // We force the value since we do not get here if it was already set.
  this->SetConfigDirCacheVariable(init);

  return found;
}